

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ArrayPtr<const_char> kj::_::splitNext(ArrayPtr<const_char> *cursor,char delimiter)

{
  char *__s;
  void *pvVar1;
  undefined3 in_register_00000031;
  size_t __n;
  ArrayPtr<const_char> AVar2;
  
  __s = cursor->ptr;
  __n = cursor->size_;
  pvVar1 = memchr(__s,CONCAT31(in_register_00000031,delimiter),__n);
  if (pvVar1 == (void *)0x0) {
    cursor->ptr = (char *)0x0;
    cursor->size_ = 0;
  }
  else {
    cursor->ptr = (char *)((long)pvVar1 + 1);
    cursor->size_ = ~((long)pvVar1 - (long)__s) + __n;
    __n = (long)pvVar1 - (long)__s;
  }
  AVar2.size_ = __n;
  AVar2.ptr = __s;
  return AVar2;
}

Assistant:

kj::ArrayPtr<const char> splitNext(kj::ArrayPtr<const char>& cursor, char delimiter) {
  // Consumes and returns the next item in a delimited list.
  //
  // If a delimiter is found:
  //  - `cursor` is updated to point to the rest of the string after the delimiter.
  //  - The text before the delimiter is returned.
  // If no delimiter is found:
  //  - `cursor` is updated to an empty string.
  //  - The text that had been in `cursor` is returned.
  //
  // (It's up to the caller to stop the loop once `cursor` is empty.)
  KJ_IF_SOME(index, cursor.findFirst(delimiter)) {
    auto part = cursor.first(index);
    cursor = cursor.slice(index + 1, cursor.size());
    return part;
  }
  kj::ArrayPtr<const char> result(kj::mv(cursor));
  cursor = nullptr;

  return result;
}